

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O0

void lightPlainFitting(structure_light *light)

{
  float fVar1;
  float fVar2;
  size_type sVar3;
  double *pdVar4;
  ulong uVar5;
  reference pvVar6;
  ostream *poVar7;
  void *this;
  undefined1 auVar8 [16];
  _OutputArray local_5b0;
  _InputArray local_598;
  _InputArray local_580;
  int local_564;
  MatExpr local_560 [4];
  int i;
  MatExpr local_400 [8];
  Mat X;
  MatExpr local_3a0 [352];
  MatExpr local_240 [8];
  Mat B;
  MatExpr local_1d0 [352];
  MatExpr local_70 [8];
  Mat A;
  structure_light *light_local;
  
  cv::Mat::zeros((int)local_1d0,3,3);
  cv::MatExpr::operator_cast_to_Mat(local_70);
  cv::MatExpr::~MatExpr(local_1d0);
  cv::Mat::zeros((int)local_3a0,3,1);
  cv::MatExpr::operator_cast_to_Mat(local_240);
  cv::MatExpr::~MatExpr(local_3a0);
  cv::Mat::zeros((int)local_560,3,1);
  cv::MatExpr::operator_cast_to_Mat(local_400);
  cv::MatExpr::~MatExpr(local_560);
  sVar3 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::size
                    (&light->lightPlanePoint);
  auVar8._8_4_ = (int)(sVar3 >> 0x20);
  auVar8._0_8_ = sVar3;
  auVar8._12_4_ = 0x45300000;
  pdVar4 = cv::Mat::at<double>((Mat *)local_70,2,2);
  *pdVar4 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0);
  local_564 = 0;
  while( true ) {
    uVar5 = (ulong)local_564;
    sVar3 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::size
                      (&light->lightPlanePoint);
    if (sVar3 <= uVar5) break;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->x;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar2 = pvVar6->x;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,0,0);
    *pdVar4 = *pdVar4 + (double)(fVar1 * fVar2);
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->x;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar2 = pvVar6->y;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,0,1);
    *pdVar4 = *pdVar4 + (double)(fVar1 * fVar2);
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->x;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,0,2);
    *pdVar4 = *pdVar4 + (double)fVar1;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->x;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar2 = pvVar6->y;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,1,0);
    *pdVar4 = *pdVar4 + (double)(fVar1 * fVar2);
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->y;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar2 = pvVar6->y;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,1,1);
    *pdVar4 = *pdVar4 + (double)(fVar1 * fVar2);
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->y;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,1,2);
    *pdVar4 = *pdVar4 + (double)fVar1;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->x;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,2,0);
    *pdVar4 = *pdVar4 + (double)fVar1;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->y;
    pdVar4 = cv::Mat::at<double>((Mat *)local_70,2,1);
    *pdVar4 = *pdVar4 + (double)fVar1;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->x;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar2 = pvVar6->z;
    pdVar4 = cv::Mat::at<double>((Mat *)local_240,0,0);
    *pdVar4 = *pdVar4 + (double)(fVar1 * fVar2);
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->y;
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar2 = pvVar6->z;
    pdVar4 = cv::Mat::at<double>((Mat *)local_240,1,0);
    *pdVar4 = *pdVar4 + (double)(fVar1 * fVar2);
    pvVar6 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                       (&light->lightPlanePoint,(long)local_564);
    fVar1 = pvVar6->z;
    pdVar4 = cv::Mat::at<double>((Mat *)local_240,2,0);
    *pdVar4 = (double)fVar1 + *pdVar4;
    local_564 = local_564 + 1;
  }
  cv::_InputArray::_InputArray(&local_580,(Mat *)local_70);
  cv::_InputArray::_InputArray(&local_598,(Mat *)local_240);
  cv::_OutputArray::_OutputArray(&local_5b0,(Mat *)local_400);
  cv::solve(&local_580,&local_598,&local_5b0,0);
  cv::_OutputArray::~_OutputArray(&local_5b0);
  cv::_InputArray::~_InputArray(&local_598);
  cv::_InputArray::~_InputArray(&local_580);
  poVar7 = std::operator<<((ostream *)&std::cout,"X:");
  poVar7 = cv::operator<<(poVar7,(Mat *)local_400);
  this = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  pdVar4 = cv::Mat::at<double>((Mat *)local_400,0,0);
  light->planeFormular[0] = -*pdVar4;
  pdVar4 = cv::Mat::at<double>((Mat *)local_400,1,0);
  light->planeFormular[1] = -*pdVar4;
  light->planeFormular[2] = 1.0;
  pdVar4 = cv::Mat::at<double>((Mat *)local_400,2,0);
  light->planeFormular[3] = *pdVar4;
  cv::Mat::~Mat((Mat *)local_400);
  cv::Mat::~Mat((Mat *)local_240);
  cv::Mat::~Mat((Mat *)local_70);
  return;
}

Assistant:

void lightPlainFitting(structure_light &light)
{
    Mat A = Mat::zeros(3, 3, CV_64FC1);//定义拟合所需要的三个矩阵
    Mat B = Mat::zeros(3, 1, CV_64FC1);
    Mat X = Mat::zeros(3, 1, CV_64FC1);

    A.at<double>(2, 2) = light.lightPlanePoint.size();
    for (int i = 0; i < light.lightPlanePoint.size(); i++)
    {
        A.at<double>(0, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].x;
        A.at<double>(0, 1) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].y;
        A.at<double>(0, 2) += light.lightPlanePoint[i].x;
        A.at<double>(1, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].y;
        A.at<double>(1, 1) += light.lightPlanePoint[i].y*light.lightPlanePoint[i].y;
        A.at<double>(1, 2) += light.lightPlanePoint[i].y;
        A.at<double>(2, 0) += light.lightPlanePoint[i].x;
        A.at<double>(2, 1) += light.lightPlanePoint[i].y;
        B.at<double>(0, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].z;
        B.at<double>(1, 0) += light.lightPlanePoint[i].y*light.lightPlanePoint[i].z;
        B.at<double>(2, 0) += light.lightPlanePoint[i].z;
    }

    solve(A, B, X);

    cout << "X:" << X << endl << endl;

    light.planeFormular[0] = -X.at<double>(0, 0);//x
    light.planeFormular[1] = -X.at<double>(1, 0);//y
    light.planeFormular[2] = 1;//z
    light.planeFormular[3] = X.at<double>(2, 0);//常数项
}